

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::UniformType::UniformType
          (UniformType *this,UniformStructCounter *structCounter,
          vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
          *_childTypes,int _arraySize)

{
  int *__x;
  int iVar1;
  ostream *this_00;
  ostringstream _str;
  string asStack_1c8 [32];
  ostream local_1a8;
  
  this->enumType = 0;
  (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->arraySize = _arraySize;
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::vector(&this->childTypes,_childTypes);
  (this->strType)._M_dataplus._M_p = (pointer)&(this->strType).field_2;
  (this->strType)._M_string_length = 0;
  (this->strType).field_2._M_local_buf[0] = '\0';
  (this->refStrType)._M_dataplus._M_p = (pointer)&(this->refStrType).field_2;
  (this->refStrType)._M_string_length = 0;
  (this->refStrType).field_2._M_local_buf[0] = '\0';
  (this->size).first = 0;
  (this->size).second = 0;
  this->isArray = 0 < _arraySize;
  this->signedType = true;
  this->baseType = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  this_00 = std::operator<<(&local_1a8,"S");
  iVar1 = structCounter->counter;
  structCounter->counter = iVar1 + 1;
  std::ostream::operator<<(this_00,iVar1);
  std::__cxx11::stringbuf::str();
  __x = &this->arraySize;
  std::__cxx11::string::operator=((string *)&this->strType,asStack_1c8);
  std::__cxx11::string::~string(asStack_1c8);
  if (*__x == 0) {
    *__x = 1;
  }
  std::vector<int,_std::allocator<int>_>::push_back(&this->arraySizesSegmented,__x);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  return;
}

Assistant:

UniformType(UniformStructCounter& structCounter, std::vector<UniformType> _childTypes, int _arraySize = 0)
		: enumType(0), arraySize(_arraySize), childTypes(_childTypes), isArray(_arraySize > 0), signedType(true)
	{
		baseType = 0;
		std::ostringstream _str;
		_str << "S" << structCounter.getNextCount();
		strType = _str.str();
		if (!arraySize)
		{
			arraySize = 1;
		}
		arraySizesSegmented.push_back(arraySize);
	}